

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

__pid_t __thiscall cimg_library::CImgDisplay::wait(CImgDisplay *this,void *__stat_loc)

{
  uint milliseconds_local;
  CImgDisplay *this_local;
  
  cimg::wait((cimg *)((ulong)__stat_loc & 0xffffffff),this);
  return (__pid_t)this;
}

Assistant:

CImgDisplay& wait(const unsigned int milliseconds) {
      cimg::wait(milliseconds,&_timer);
      return *this;
    }